

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

void __thiscall leveldb::Block::Iter::Seek(Iter *this,Slice *target)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  byte *p;
  uint index;
  byte *pbVar5;
  uint uVar6;
  byte *limit;
  uint index_00;
  bool bVar7;
  uint32_t non_shared;
  uint32_t value_length;
  uint32_t shared;
  Slice mid_key;
  uint local_4c;
  uint local_48;
  uint local_44;
  byte *local_40;
  ulong local_38;
  
  uVar6 = this->num_restarts_ - 1;
  index_00 = 0;
  do {
    if (uVar6 <= index_00) {
      (this->key_)._M_string_length = 0;
      *(this->key_)._M_dataplus._M_p = '\0';
      this->restart_index_ = index_00;
      uVar2 = GetRestartPoint(this,index_00);
      (this->value_).data_ = this->data_ + uVar2;
      (this->value_).size_ = 0;
      do {
        bVar7 = ParseNextKey(this);
        if (!bVar7) {
          return;
        }
        local_40 = (byte *)(this->key_)._M_dataplus._M_p;
        local_38 = (this->key_)._M_string_length;
        iVar4 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_40,target);
      } while (iVar4 < 0);
      return;
    }
    index = uVar6 + index_00 + 1 >> 1;
    uVar2 = GetRestartPoint(this,index);
    uVar3 = this->restarts_;
    if ((long)((ulong)uVar3 - (ulong)uVar2) < 3) {
LAB_00124534:
      pbVar5 = (byte *)0x0;
    }
    else {
      pbVar5 = (byte *)(this->data_ + uVar2);
      limit = (byte *)(this->data_ + uVar3);
      local_44 = (uint)*pbVar5;
      local_4c = (uint)pbVar5[1];
      local_48 = (uint)pbVar5[2];
      if ((byte)(pbVar5[1] | *pbVar5 | pbVar5[2]) < 0x80) {
        pbVar5 = pbVar5 + 3;
      }
      else {
        if (uVar2 < uVar3) {
          uVar3 = (uint)(char)*pbVar5;
          p = (byte *)(ulong)uVar3;
          if ((int)uVar3 < 0) goto LAB_001244c1;
          pbVar5 = pbVar5 + 1;
          local_44 = uVar3;
        }
        else {
LAB_001244c1:
          p = (byte *)GetVarint32PtrFallback((char *)pbVar5,(char *)limit,&local_44);
          pbVar5 = p;
        }
        if (pbVar5 == (byte *)0x0) goto LAB_00124534;
        if (pbVar5 < limit) {
          bVar1 = *pbVar5;
          if (-1 < (char)bVar1) {
            p = pbVar5 + 1;
            local_4c = (int)(char)bVar1;
          }
          if ((char)bVar1 < '\0') goto LAB_001244ee;
        }
        else {
LAB_001244ee:
          p = (byte *)GetVarint32PtrFallback((char *)pbVar5,(char *)limit,&local_4c);
        }
        if (p == (byte *)0x0) goto LAB_00124534;
        if (p < limit) {
          bVar1 = *p;
          if (-1 < (char)bVar1) {
            pbVar5 = p + 1;
            local_48 = (int)(char)bVar1;
          }
          if ((char)bVar1 < '\0') goto LAB_00124518;
        }
        else {
LAB_00124518:
          pbVar5 = (byte *)GetVarint32PtrFallback((char *)p,(char *)limit,&local_48);
        }
        if (pbVar5 == (byte *)0x0) goto LAB_00124534;
      }
      if ((uint)((int)limit - (int)pbVar5) < local_48 + local_4c) goto LAB_00124534;
    }
    bVar7 = local_44 != 0;
    if (bVar7 || pbVar5 == (byte *)0x0) {
      CorruptionError(this);
      uVar3 = uVar6;
    }
    else {
      local_38 = (ulong)local_4c;
      local_40 = pbVar5;
      iVar4 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_40,target);
      uVar3 = index - 1;
      if (iVar4 < 0) {
        index_00 = index;
        uVar3 = uVar6;
      }
    }
    uVar6 = uVar3;
    if (bVar7 || pbVar5 == (byte *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void Seek(const Slice& target) override {
    // Binary search in restart array to find the last restart point
    // with a key < target
    uint32_t left = 0;
    uint32_t right = num_restarts_ - 1;
    while (left < right) {
      uint32_t mid = (left + right + 1) / 2;
      uint32_t region_offset = GetRestartPoint(mid);
      uint32_t shared, non_shared, value_length;
      const char* key_ptr =
          DecodeEntry(data_ + region_offset, data_ + restarts_, &shared,
                      &non_shared, &value_length);
      if (key_ptr == nullptr || (shared != 0)) {
        CorruptionError();
        return;
      }
      Slice mid_key(key_ptr, non_shared);
      if (Compare(mid_key, target) < 0) {
        // Key at "mid" is smaller than "target".  Therefore all
        // blocks before "mid" are uninteresting.
        left = mid;
      } else {
        // Key at "mid" is >= "target".  Therefore all blocks at or
        // after "mid" are uninteresting.
        right = mid - 1;
      }
    }

    // Linear search (within restart block) for first key >= target
    SeekToRestartPoint(left);
    while (true) {
      if (!ParseNextKey()) {
        return;
      }
      if (Compare(key_, target) >= 0) {
        return;
      }
    }
  }